

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>
llbuild::core::createSQLiteBuildDB
          (StringRef path,uint32_t clientSchemaVersion,bool recreateUnmatchedVersion,
          string *error_out)

{
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  __uniq_ptr_data<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>,_true,_true>
  this;
  unique_ptr<(anonymous_namespace)::SQLiteBuildDB,_std::default_delete<(anonymous_namespace)::SQLiteBuildDB>_>
  local_38 [2];
  string *error_out_local;
  undefined1 auStack_20 [3];
  bool recreateUnmatchedVersion_local;
  uint32_t clientSchemaVersion_local;
  StringRef path_local;
  
  path_local.Data = (char *)CONCAT44(in_register_00000014,clientSchemaVersion);
  _auStack_20 = (char *)path.Length;
  this.super___uniq_ptr_impl<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>.
  _M_t.
  super__Tuple_impl<0UL,_llbuild::core::BuildDB_*,_std::default_delete<llbuild::core::BuildDB>_>.
  super__Head_base<0UL,_llbuild::core::BuildDB_*,_false>._M_head_impl =
       (__uniq_ptr_impl<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>)
       path.Data;
  error_out_local._4_4_ = (undefined4)CONCAT71(in_register_00000009,recreateUnmatchedVersion);
  error_out_local._3_1_ = (byte)error_out & 1;
  path_local.Length =
       (size_t)this.
               super___uniq_ptr_impl<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::core::BuildDB_*,_std::default_delete<llbuild::core::BuildDB>_>
               .super__Head_base<0UL,_llbuild::core::BuildDB_*,_false>._M_head_impl;
  llvm::make_unique<(anonymous_namespace)::SQLiteBuildDB,llvm::StringRef&,unsigned_int&,bool&>
            ((llvm *)local_38,(StringRef *)auStack_20,(uint *)((long)&error_out_local + 4),
             (bool *)((long)&error_out_local + 3));
  std::unique_ptr<llbuild::core::BuildDB,std::default_delete<llbuild::core::BuildDB>>::
  unique_ptr<(anonymous_namespace)::SQLiteBuildDB,std::default_delete<(anonymous_namespace)::SQLiteBuildDB>,void>
            ((unique_ptr<llbuild::core::BuildDB,std::default_delete<llbuild::core::BuildDB>> *)
             this.
             super___uniq_ptr_impl<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::core::BuildDB_*,_std::default_delete<llbuild::core::BuildDB>_>
             .super__Head_base<0UL,_llbuild::core::BuildDB_*,_false>._M_head_impl,local_38);
  std::
  unique_ptr<(anonymous_namespace)::SQLiteBuildDB,_std::default_delete<(anonymous_namespace)::SQLiteBuildDB>_>
  ::~unique_ptr(local_38);
  return (__uniq_ptr_data<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>,_true,_true>
          )(tuple<llbuild::core::BuildDB_*,_std::default_delete<llbuild::core::BuildDB>_>)
           this.
           super___uniq_ptr_impl<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::core::BuildDB_*,_std::default_delete<llbuild::core::BuildDB>_>
           .super__Head_base<0UL,_llbuild::core::BuildDB_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<BuildDB> core::createSQLiteBuildDB(StringRef path,
                                                   uint32_t clientSchemaVersion,
                                                   bool recreateUnmatchedVersion,
                                                   std::string *error_out) {
  return llvm::make_unique<SQLiteBuildDB>(path, clientSchemaVersion, recreateUnmatchedVersion);
}